

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# monitor.c
# Opt level: O3

int compareVideoModes(void *fp,void *sp)

{
  int iVar1;
  
  iVar1 = (*(int *)((long)fp + 0xc) + *(int *)((long)fp + 8) + *(int *)((long)fp + 0x10)) -
          (*(int *)((long)sp + 0xc) + *(int *)((long)sp + 8) + *(int *)((long)sp + 0x10));
  if ((iVar1 == 0) &&
     (iVar1 = *(int *)((long)fp + 4) * *fp - *(int *)((long)sp + 4) * *sp, iVar1 == 0)) {
    iVar1 = *(int *)((long)fp + 0x14) - *(int *)((long)sp + 0x14);
  }
  return iVar1;
}

Assistant:

static int compareVideoModes(const void* fp, const void* sp)
{
    const GLFWvidmode* fm = fp;
    const GLFWvidmode* sm = sp;
    const int fbpp = fm->redBits + fm->greenBits + fm->blueBits;
    const int sbpp = sm->redBits + sm->greenBits + sm->blueBits;
    const int farea = fm->width * fm->height;
    const int sarea = sm->width * sm->height;

    // First sort on color bits per pixel
    if (fbpp != sbpp)
        return fbpp - sbpp;

    // Then sort on screen area
    if (farea != sarea)
        return farea - sarea;

    // Lastly sort on refresh rate
    return fm->refreshRate - sm->refreshRate;
}